

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

base_block_t *
base_block_alloc(tsdn_t *tsdn,base_t *base,ehooks_t *ehooks,uint ind,pszind_t *pind_last,
                size_t *duckdb_je_extent_sn_next,size_t size,size_t alignment)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  base_t *pbVar6;
  base_t *base_00;
  long in_RSI;
  int *in_R8;
  ulong in_stack_00000010;
  void *addr;
  base_block_t *block;
  size_t block_size;
  size_t next_block_size;
  pszind_t pind_next;
  size_t min_block_size;
  size_t gap_size;
  size_t header_size;
  size_t usize;
  pszind_t ind_2;
  pszind_t base_ind_1;
  pszind_t rg_inner_off_1;
  pszind_t lg_delta_1;
  pszind_t off_to_first_ps_rg_1;
  pszind_t x_1;
  pszind_t ind_1;
  pszind_t base_ind;
  pszind_t rg_inner_off;
  pszind_t lg_delta;
  pszind_t off_to_first_ps_rg;
  pszind_t x;
  size_t in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int iVar7;
  int iVar8;
  undefined8 in_stack_ffffffffffffff30;
  uint ind_00;
  ehooks_t *in_stack_ffffffffffffff38;
  base_t *pbVar9;
  base_block_t *local_58;
  int local_2c;
  
  ind_00 = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  in_stack_00000010 = in_stack_00000010 + 0xf & 0xfffffffffffffff0;
  sVar5 = sz_psz2u((size_t)in_stack_ffffffffffffff38);
  pbVar6 = (base_t *)(sVar5 + 0x1fffff & 0xffffffffffe00000);
  uVar2 = *in_R8 + 1;
  uVar3 = lg_ceil(0x24c7f9e);
  if (uVar3 < 0xe) {
    iVar8 = 0;
  }
  else {
    iVar8 = uVar3 - 0xe;
  }
  if (iVar8 == 0) {
    iVar7 = 0xc;
  }
  else {
    iVar7 = iVar8 + 0xb;
  }
  if (uVar2 < iVar8 * 4 + ((uint)(0x6fffffffffffffff >> ((byte)iVar7 & 0x3f)) & 3)) {
    iVar4 = *in_R8 + 1;
  }
  else {
    iVar4 = *in_R8;
  }
  sVar5 = sz_pind2sz(0);
  base_00 = (base_t *)(sVar5 + 0x1fffff & 0xffffffffffe00000);
  if (base_00 < pbVar6) {
    base_00 = pbVar6;
  }
  pbVar6 = base_00;
  local_58 = (base_block_t *)
             base_map((tsdn_t *)base_00,in_stack_ffffffffffffff38,ind_00,CONCAT44(uVar2,iVar8));
  if (local_58 == (base_block_t *)0x0) {
    local_58 = (base_block_t *)0x0;
  }
  else {
    _Var1 = metadata_thp_madvise();
    if (_Var1) {
      if (duckdb_je_opt_metadata_thp == metadata_thp_always) {
        duckdb_je_pages_huge
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
      }
      else if ((duckdb_je_opt_metadata_thp == metadata_thp_auto) && (in_RSI != 0)) {
        malloc_mutex_lock((tsdn_t *)CONCAT44(uVar2,iVar8),(malloc_mutex_t *)CONCAT44(iVar7,iVar4));
        base_auto_thp_switch((tsdn_t *)CONCAT44(iVar7,iVar4),base_00);
        if ((*(byte *)(in_RSI + 0x90) & 1) != 0) {
          duckdb_je_pages_huge
                    ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08);
        }
        malloc_mutex_unlock((tsdn_t *)CONCAT44(iVar7,iVar4),(malloc_mutex_t *)base_00);
      }
    }
    if (pbVar6 < (base_t *)0x7000000000000001) {
      pbVar9 = pbVar6;
      uVar2 = lg_ceil(0x24c820c);
      if (uVar2 < 0xe) {
        in_stack_ffffffffffffff14 = 0;
      }
      else {
        in_stack_ffffffffffffff14 = uVar2 - 0xe;
      }
      if (in_stack_ffffffffffffff14 == 0) {
        in_stack_ffffffffffffff10 = 0xc;
      }
      else {
        in_stack_ffffffffffffff10 = in_stack_ffffffffffffff14 + 0xb;
      }
      local_2c = in_stack_ffffffffffffff14 * 4 +
                 ((uint)((ulong)((long)&pbVar6[-1].n_thp + 7U) >>
                        ((byte)in_stack_ffffffffffffff10 & 0x3f)) & 3);
      pbVar6 = pbVar9;
    }
    else {
      local_2c = 199;
    }
    *in_R8 = local_2c;
    local_58->size = (size_t)pbVar6;
    local_58->next = (base_block_t *)0x0;
    base_edata_init((size_t *)CONCAT44(iVar7,iVar4),(edata_t *)base_00,
                    (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    in_stack_ffffffffffffff08);
  }
  return local_58;
}

Assistant:

static base_block_t *
base_block_alloc(tsdn_t *tsdn, base_t *base, ehooks_t *ehooks, unsigned ind,
    pszind_t *pind_last, size_t *extent_sn_next, size_t size,
    size_t alignment) {
	alignment = ALIGNMENT_CEILING(alignment, QUANTUM);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t header_size = sizeof(base_block_t);
	size_t gap_size = ALIGNMENT_CEILING(header_size, alignment) -
	    header_size;
	/*
	 * Create increasingly larger blocks in order to limit the total number
	 * of disjoint virtual memory ranges.  Choose the next size in the page
	 * size class series (skipping size classes that are not a multiple of
	 * HUGEPAGE), or a size large enough to satisfy the requested size and
	 * alignment, whichever is larger.
	 */
	size_t min_block_size = HUGEPAGE_CEILING(sz_psz2u(header_size + gap_size
	    + usize));
	pszind_t pind_next = (*pind_last + 1 < sz_psz2ind(SC_LARGE_MAXCLASS)) ?
	    *pind_last + 1 : *pind_last;
	size_t next_block_size = HUGEPAGE_CEILING(sz_pind2sz(pind_next));
	size_t block_size = (min_block_size > next_block_size) ? min_block_size
	    : next_block_size;
	base_block_t *block = (base_block_t *)base_map(tsdn, ehooks, ind,
	    block_size);
	if (block == NULL) {
		return NULL;
	}

	if (metadata_thp_madvise()) {
		void *addr = (void *)block;
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (block_size & HUGEPAGE_MASK) == 0);
		if (opt_metadata_thp == metadata_thp_always) {
			pages_huge(addr, block_size);
		} else if (opt_metadata_thp == metadata_thp_auto &&
		    base != NULL) {
			/* base != NULL indicates this is not a new base. */
			malloc_mutex_lock(tsdn, &base->mtx);
			base_auto_thp_switch(tsdn, base);
			if (base->auto_thp_switched) {
				pages_huge(addr, block_size);
			}
			malloc_mutex_unlock(tsdn, &base->mtx);
		}
	}

	*pind_last = sz_psz2ind(block_size);
	block->size = block_size;
	block->next = NULL;
	assert(block_size >= header_size);
	base_edata_init(extent_sn_next, &block->edata,
	    (void *)((byte_t *)block + header_size), block_size - header_size);
	return block;
}